

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filewatcher.cpp
# Opt level: O0

void FileWatcherDestroy(HFileWatcher handle)

{
  FileWatcher *watcher;
  HFileWatcher handle_local;
  
  std::atomic<bool>::store((atomic<bool> *)((long)handle + 0x28),true,memory_order_seq_cst);
  std::thread::join();
  if (handle != (HFileWatcher)0x0) {
    FileWatcher::~FileWatcher((FileWatcher *)handle);
    operator_delete(handle,0x68);
  }
  return;
}

Assistant:

void FileWatcherDestroy(HFileWatcher handle) {
    FileWatcher* watcher = (FileWatcher*)handle;
    watcher->ShouldQuit.store(true);
    watcher->WatcherThread.join();
    delete watcher;
}